

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O1

void __thiscall CVmObjTads::build_prop_list(CVmObjTads *this,vm_obj_id_t self,vm_val_t *retval)

{
  char *pcVar1;
  vm_obj_id_t vVar2;
  ulong element_count;
  uint16_t tmp;
  size_t idx;
  ulong uVar3;
  vm_prop_id_t *pvVar4;
  CVmObjList *this_00;
  vm_val_t val;
  vm_val_t local_38;
  
  pcVar1 = (this->super_CVmObject).ext_;
  element_count = (ulong)*(ushort *)(pcVar1 + 0x22);
  uVar3 = 0;
  vVar2 = CVmObjList::create(0,element_count);
  retval->typ = VM_OBJ;
  (retval->val).obj = vVar2;
  this_00 = (CVmObjList *)
            ((long)&G_obj_table_X.pages_[vVar2 >> 0xc]->ptr_ + (ulong)((vVar2 & 0xfff) * 0x18));
  if (element_count != 0) {
    pvVar4 = *(vm_prop_id_t **)(pcVar1 + 0x18);
    idx = 0;
    do {
      local_38.val.prop = *pvVar4;
      local_38.typ = VM_PROP;
      uVar3 = idx + 1;
      CVmObjList::cons_set_element(this_00,idx,&local_38);
      pvVar4 = pvVar4 + 0x14;
      idx = uVar3;
    } while (element_count != uVar3);
  }
  *(short *)(this_00->super_CVmObjCollection).super_CVmObject.ext_ = (short)uVar3;
  return;
}

Assistant:

void CVmObjTads::build_prop_list(VMG_ vm_obj_id_t self, vm_val_t *retval)
{
    size_t cnt;
    size_t idx;
    CVmObjList *lst;
    vm_tadsobj_prop *entry;
    vm_tadsobj_hdr *hdr = get_hdr();
    
    /* the next free index is also the number of properties we have */
    cnt = hdr->prop_entry_free;

    /* allocate a list big enough for all of our properties */
    retval->set_obj(CVmObjList::create(vmg_ FALSE, cnt));

    /* get the list object, property cast */
    lst = (CVmObjList *)vm_objp(vmg_ retval->val.obj);

    /* add our image file properties to the list */
    for (idx = 0, entry = hdr->prop_entry_arr ; cnt != 0 ;
         --cnt, ++entry)
    {
        /* make a value for this property ID */
        vm_val_t val;
        val.set_propid(entry->prop);

        /* add it to the list */
        lst->cons_set_element(idx++, &val);
    }

    /* set the final length of the list */
    lst->cons_set_len(idx);
}